

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_search.cpp
# Opt level: O0

void __thiscall
ANNkd_tree::annkSearch
          (ANNkd_tree *this,ANNpoint q,int k,ANNidxArray nn_idx,ANNdistArray dd,double eps)

{
  long *plVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  PQKinfo PVar4;
  ulong uVar5;
  ANNmin_k *pAVar6;
  double *in_RCX;
  int in_EDX;
  ANNpoint in_RSI;
  ANNpoint in_RDI;
  int *in_R8;
  double in_XMM0_Qa;
  PQKkey PVar7;
  ANNpoint unaff_retaddr;
  int i_1;
  int i;
  undefined8 in_stack_ffffffffffffff88;
  ANNerr level;
  ANNmin_k *pAVar8;
  ANNmin_k *in_stack_ffffffffffffff90;
  int local_48;
  int local_34;
  ANNpoint pAVar9;
  ANNpoint lo;
  
  level = (ANNerr)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  ANNkdDim = *(int *)(in_RDI + 1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)*(int *)(in_RDI + 1);
  uVar5 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  lo = in_RDI;
  ANNScale = (double *)operator_new__(uVar5);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)*(int *)(in_RDI + 1);
  uVar5 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pAVar9 = in_RSI;
  ANNTopology = (int *)operator_new__(uVar5);
  ANNkdQ = pAVar9;
  for (local_34 = 0; local_34 < *(int *)(in_RDI + 1); local_34 = local_34 + 1) {
    ANNScale[local_34] = *(double *)((long)in_RDI[2] + (long)local_34 * 8);
    ANNTopology[local_34] = *(int *)((long)in_RDI[3] + (long)local_34 * 4);
  }
  ANNkdPts = (ANNpointArray)in_RDI[5];
  ANNptsVisited = 0;
  pAVar9 = ANNkdQ;
  if (*(int *)((long)in_RDI + 0xc) < in_EDX) {
    annError((char *)in_stack_ffffffffffffff90,level);
  }
  ANNkdMaxErr = (in_XMM0_Qa + 1.0) * (in_XMM0_Qa + 1.0);
  pAVar6 = (ANNmin_k *)operator_new(0x10);
  ANNmin_k::ANNmin_k(in_stack_ffffffffffffff90,level);
  plVar1 = (long *)in_RDI[7];
  ANNkdPointMK = pAVar6;
  annBoxDistance(unaff_retaddr,lo,pAVar9,in_EDX,in_RCX,in_R8);
  (**(code **)(*plVar1 + 0x10))();
  for (local_48 = 0; local_48 < in_EDX; local_48 = local_48 + 1) {
    PVar7 = ANNmin_k::ith_smallest_key(ANNkdPointMK,local_48);
    *(PQKkey *)(in_R8 + (long)local_48 * 2) = PVar7;
    PVar4 = ANNmin_k::ith_smallest_info(ANNkdPointMK,local_48);
    *(PQKinfo *)((long)in_RCX + (long)local_48 * 4) = PVar4;
  }
  if (ANNScale != (double *)0x0) {
    operator_delete__(ANNScale);
  }
  pAVar6 = (ANNmin_k *)ANNTopology;
  if (ANNTopology != (int *)0x0) {
    operator_delete__(ANNTopology);
  }
  if (ANNkdPointMK != (ANNmin_k *)0x0) {
    pAVar8 = ANNkdPointMK;
    ANNmin_k::~ANNmin_k(pAVar6);
    operator_delete(pAVar8);
  }
  return;
}

Assistant:

void ANNkd_tree::annkSearch(
    ANNpoint q,          // the query point
    int k,               // number of near neighbors to return
    ANNidxArray nn_idx,  // nearest neighbor indices (returned)
    ANNdistArray dd,     // the approximate nearest neighbor
    double eps)          // the error bound
{
    ANNkdDim = dim;  // copy arguments to static equivs
    ANNScale = new double[dim];
    ANNTopology = new int[dim];
    for (int i = 0; i < dim; i++) {
        ANNScale[i] = Scale[i];
        ANNTopology[i] = Topology[i];
    }
    ANNkdQ = q;
    ANNkdPts = pts;
    ANNptsVisited = 0;  // initialize count of points visited

    if (k > n_pts) {  // too many near neighbors?
        annError("Requesting more near neighbors than data points", ANNabort);
    }

    ANNkdMaxErr = ANN_POW(1.0 + eps);
    //    FLOP(2)				// increment floating op count

    ANNkdPointMK = new ANNmin_k(k);  // create set for closest k points
                                     // search starting at the root
    root->ann_search(
        annBoxDistance(q, bnd_box_lo, bnd_box_hi, dim, ANNScale, ANNTopology));

    for (int i = 0; i < k; i++) {  // extract the k-th closest points
        dd[i] = ANNkdPointMK->ith_smallest_key(i);
        nn_idx[i] = ANNkdPointMK->ith_smallest_info(i);
    }
    delete[] ANNScale;
    delete[] ANNTopology;
    delete ANNkdPointMK;  // deallocate closest point set
}